

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O2

char * labelFromModel(mdl_t *mdl,char *inBuf)

{
  int iVar1;
  size_t __len;
  char *__s;
  FILE *__stream;
  FILE *__stream_00;
  ulong __n;
  
  __len = strlen(inBuf);
  __n = (ulong)((int)__len * 2);
  __s = (char *)operator_new__(__n);
  memset(__s,0,__n);
  __stream = fmemopen(inBuf,__len,"r");
  if (__stream == (FILE *)0x0) {
    pfatal("Cannot open input data buffer: %s\n",inBuf);
  }
  __stream_00 = fmemopen(__s,__n,"w");
  if (__stream_00 == (FILE *)0x0) {
    pfatal("Cannot open output data buffer");
  }
  iVar1 = tag_label(mdl,(FILE *)__stream,(FILE *)__stream_00);
  if (iVar1 == 0) {
    __s = (char *)0x0;
    warning("Cannot apply patterns, most likely wrong input data\n");
  }
  else {
    fclose(__stream);
    fclose(__stream_00);
  }
  return __s;
}

Assistant:

char* labelFromModel(mdl_t *mdl, char* inBuf) {
        int bufSize = strlen(inBuf) * 2;
        char* outBuf = new char[bufSize];
        memset(outBuf, 0, bufSize);

    	// Open input and output files
    	FILE *fin, *fout;

        fin = fmemopen(inBuf, strlen(inBuf), "r");
        if (fin == NULL) {
            pfatal("Cannot open input data buffer: %s\n", inBuf);
        }

        fout = fmemopen(outBuf, bufSize, "w");
        if (fout == NULL) {
            pfatal("Cannot open output data buffer");
        }

    	// Do the labelling
    	//info("* Label sequences\n");
    	if (!tag_label(mdl, fin, fout)) {
            warning("Cannot apply patterns, most likely wrong input data\n");
            return NULL;
        }
    	//info("* Done\n");
    	// And close files
//    	if (mdl->opt->input != NULL)
    		fclose(fin);
  //  	if (mdl->opt->output != NULL)
    		fclose(fout);

        return outBuf;
    }